

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O3

int CheckBig(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  uint uVar3;
  int i;
  bool bVar4;
  int n;
  uint b;
  uint local_30;
  uint local_2c;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar1 = -1;
    goto LAB_00102ad3;
  }
  pcVar2 = ScanInt((FILE *)__stream,(int *)&local_30);
  bVar4 = true;
  if ((pcVar2 == "PASSED") && (local_30 == 0)) {
    uVar3 = 0xffffffff;
    do {
      if (uVar3 == 2) {
        bVar4 = false;
        goto LAB_00102a15;
      }
      pcVar2 = ScanInt((FILE *)__stream,(int *)&local_30);
      uVar3 = uVar3 + 1;
    } while ((pcVar2 == "PASSED") && (local_30 == 0));
    bVar4 = uVar3 < 3;
  }
  printf("wrong output -- ");
LAB_00102a15:
  uVar3 = 1;
  do {
    pcVar2 = ScanInt((FILE *)__stream,(int *)&local_30);
    if ((pcVar2 != "PASSED") || (uVar3 != local_30)) goto LAB_00102aac;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 5);
  if (bVar4) goto LAB_00102aba;
  uVar3 = 1;
  do {
    pcVar2 = ScanUintUint((FILE *)__stream,&local_30,&local_2c);
    if (((pcVar2 != "PASSED") || (uVar3 != local_30)) || (local_2c != 8)) goto LAB_00102aac;
    uVar3 = uVar3 + 4;
  } while (uVar3 != 0x3fffffd);
  iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
  fclose(__stream);
  if (iVar1 == 0) {
    puts("PASSED");
    iVar1 = 0;
    goto LAB_00102ad3;
  }
  goto LAB_00102ac2;
LAB_00102aac:
  printf("wrong output -- ");
LAB_00102aba:
  fclose(__stream);
LAB_00102ac2:
  puts("FAILED");
  iVar1 = 1;
LAB_00102ad3:
  testN = testN + 1;
  return iVar1;
}

Assistant:

static int CheckBig(void) {
    FILE *const out = fopen("out.txt", "r");
    int passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        ++testN;
        return -1;
    }

    for (int i = 0; i < 4; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || n != 0) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }

    for (int i = 1; i < 5; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || n != i) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }

    if (passed) {
        for (unsigned int i = 0; i < 1024 * 1024 * 8 * 2 - 1; ++i) {
            unsigned int a, b;
            if (ScanUintUint(out, &a, &b) != Pass || a != 1 + i * 4 || b != 8) {
                passed = 0;
                printf("wrong output -- ");
                break;
            }
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        ++testN;
        return 0;
    } else {
        printf("FAILED\n");
       ++testN;
        return 1;
    }
}